

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v8::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  int iVar1;
  size_t sVar2;
  uint *puVar3;
  size_t n;
  size_t j;
  int i;
  bigit borrow;
  bigint *other_local;
  bigint *this_local;
  
  _i = other;
  other_local = this;
  if (other->exp_ < this->exp_) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                ,0x197,"unaligned bigints");
  }
  iVar1 = compare(this,other);
  if (iVar1 < 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                ,0x198,"");
  }
  j._4_4_ = 0;
  j._0_4_ = _i->exp_ - this->exp_;
  n = 0;
  sVar2 = buffer<unsigned_int>::size((buffer<unsigned_int> *)_i);
  for (; iVar1 = (int)j, n != sVar2; n = n + 1) {
    puVar3 = buffer<unsigned_int>::operator[]<unsigned_long>((buffer<unsigned_int> *)_i,n);
    subtract_bigits(this,iVar1,*puVar3,(bigit *)((long)&j + 4));
    j._0_4_ = (int)j + 1;
  }
  while (j._4_4_ != 0) {
    subtract_bigits(this,(int)j,0,(bigit *)((long)&j + 4));
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }